

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packetgen.cpp
# Opt level: O2

int main(void)

{
  ulong *puVar1;
  istream *piVar2;
  ostream *poVar3;
  string *this;
  int is_simple;
  uint64_t seq;
  uint64_t param;
  string serial;
  string cmd;
  string payload;
  Simple dto;
  int local_11c;
  uint64_t local_118;
  uint64_t local_110;
  undefined1 *local_108;
  undefined8 local_100;
  undefined1 local_f8 [16];
  undefined1 *local_e8;
  undefined8 local_e0;
  undefined1 local_d8 [16];
  string local_c8;
  undefined1 local_a8 [32];
  string local_88 [32];
  string local_68;
  string local_48;
  string local_28;
  
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_local_buf[0] = '\0';
  local_e8 = local_d8;
  local_e0 = 0;
  local_d8[0] = 0;
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)&local_e8);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)&local_c8);
  puVar1 = (ulong *)std::istream::operator>>((istream *)&std::cin,&local_11c);
  piVar2 = std::istream::_M_extract<unsigned_long>(puVar1);
  std::istream::_M_extract<unsigned_long>((ulong *)piVar2);
  local_108 = local_f8;
  local_100 = 0;
  local_f8[0] = 0;
  if (local_11c == 0) {
    std::__cxx11::string::string((string *)&local_68,(string *)&local_e8);
    ::dto::create((Complex *)local_a8,local_118,&local_68,&local_c8,local_110);
    std::__cxx11::string::~string((string *)&local_68);
    poVar3 = std::operator<<((ostream *)&std::cerr,"[PACKETGEN] ");
    poVar3 = operator<<(poVar3,(Complex *)local_a8);
    std::endl<char,std::char_traits<char>>(poVar3);
    ::dto::marshall<dto::Complex>(&local_48,(Complex *)local_a8);
    std::__cxx11::string::operator=((string *)&local_108,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    this = local_88;
  }
  else {
    std::__cxx11::string::string((string *)&local_28,(string *)&local_e8);
    ::dto::create((Simple *)local_a8,local_118,&local_28,&local_c8);
    std::__cxx11::string::~string((string *)&local_28);
    poVar3 = std::operator<<((ostream *)&std::cerr,"[PACKETGEN] ");
    poVar3 = operator<<(poVar3,(Simple *)local_a8);
    std::endl<char,std::char_traits<char>>(poVar3);
    ::dto::marshall<dto::Simple>(&local_48,(Simple *)local_a8);
    std::__cxx11::string::operator=((string *)&local_108,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    this = (string *)(local_a8 + 0x18);
  }
  std::__cxx11::string::~string(this);
  std::operator<<((ostream *)&std::cout,(string *)&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_c8);
  return 0;
}

Assistant:

int main() {
  int is_simple;
  uint64_t param, seq;
  std::string payload, cmd;
  std::getline(std::cin, cmd);
  std::getline(std::cin, payload);
  std::cin >> is_simple >> param >> seq;

  std::string serial;
  if (is_simple) {
    Simple dto = create(seq, cmd, payload);
    std::cerr << "[PACKETGEN] " << dto << std::endl;
    serial = marshall(dto);
  } else {
    Complex dto = create(seq, cmd, payload, param);
    std::cerr << "[PACKETGEN] " << dto << std::endl;
    serial = marshall(dto);
  }

  std::cout << serial;

  return 0;
}